

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metro_exodus.cpp
# Opt level: O3

list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::vertices
          (uGraph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  _Node *p_Var1;
  _Rb_tree_node_base *p_Var2;
  
  if (uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_ == '\0') {
    uGraph<std::__cxx11::string>::vertices();
  }
  if (uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next ==
      (_List_node_base *)&uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_) {
    for (p_Var2 = (this->adj)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->adj)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      p_Var1 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                          &uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (p_Var2 + 1));
      std::__detail::_List_node_base::_M_hook(&p_Var1->super__List_node_base);
      uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_.
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size =
           uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_.
           super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl._M_node._M_size + 1;
    }
  }
  return &uGraph<std::__cxx11::string>::vertices()::vList_abi_cxx11_;
}

Assistant:

list<ver> &vertices() {
      static list<ver> vList;
      if (!vList.empty()) return vList;
      for (auto i = adj.begin(); i != adj.end(); ++i)
        vList.push_back(i->first);
      return vList;
    }